

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O0

bool __thiscall ManifestParser::ParseFileInclude(ManifestParser *this,bool new_scope,string *err)

{
  pointer *key_00;
  BindingEnv *parent;
  FileReader *pFVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  BindingEnv *this_00;
  ulong uVar7;
  pointer ppVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  Node *local_360;
  Node *node;
  _Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true> local_338;
  _Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true> local_330;
  iterator i;
  string *abs_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  ManifestParserOptions local_2f8;
  undefined1 local_2f0 [8];
  ManifestParser subparser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  allocator<char> local_209;
  string local_208;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  EvalString let_value;
  string key;
  undefined1 local_f8 [7];
  bool ok;
  string rel_path;
  string prev_cwd;
  string dir_err;
  string parent_path;
  undefined1 local_70 [7];
  bool has_chdir;
  string path;
  undefined1 local_40 [8];
  EvalString eval;
  string *err_local;
  bool new_scope_local;
  ManifestParser *this_local;
  
  eval.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)err;
  EvalString::EvalString((EvalString *)local_40);
  bVar3 = Lexer::ReadPath(&(this->super_Parser).lexer_,(EvalString *)local_40,
                          &(eval.parsed_.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
  if (bVar3) {
    EvalString::Evaluate_abi_cxx11_((string *)local_70,(EvalString *)local_40,(Env *)this->env_);
    bVar3 = Parser::ExpectToken(&this->super_Parser,NEWLINE,
                                &(eval.parsed_.
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
    if (bVar3) {
      bVar3 = false;
      psVar6 = RelPathEnv::AsString_abi_cxx11_(&this->env_->super_RelPathEnv);
      std::__cxx11::string::string((string *)(dir_err.field_2._M_local_buf + 8),(string *)psVar6);
      std::__cxx11::string::string((string *)(prev_cwd.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(rel_path.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_f8);
      bVar2 = 1;
      do {
        bVar4 = Lexer::PeekToken(&(this->super_Parser).lexer_,INDENT);
        if (!bVar4) goto LAB_0014234e;
        key_00 = &let_value.parsed_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::string((string *)key_00);
        EvalString::EvalString((EvalString *)local_138);
        bVar4 = ParseLet(this,(string *)key_00,(EvalString *)local_138,
                         &(eval.parsed_.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
        if (bVar4) {
          bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&let_value.parsed_.
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"chdir");
          if (bVar4) {
            std::operator+(&local_178,"illegal key \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &let_value.parsed_.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::operator+(&local_158,&local_178,"\' (only \'chdir\' is supported)");
            Lexer::Error(&(this->super_Parser).lexer_,&local_158,
                         &(eval.parsed_.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)&local_178);
            bVar2 = 0;
            path.field_2._8_4_ = 3;
          }
          else if (new_scope) {
            if (bVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1c0,"duplicate \'chdir\' in subninja",&local_1c1);
              Lexer::Error(&(this->super_Parser).lexer_,&local_1c0,
                           &(eval.parsed_.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
              std::__cxx11::string::~string((string *)&local_1c0);
              std::allocator<char>::~allocator(&local_1c1);
              bVar2 = 0;
              path.field_2._8_4_ = 3;
            }
            else {
              EvalString::Evaluate_abi_cxx11_(&local_1e8,(EvalString *)local_138,(Env *)this->env_);
              std::__cxx11::string::operator=((string *)local_f8,(string *)&local_1e8);
              std::__cxx11::string::~string((string *)&local_1e8);
              lVar9 = std::__cxx11::string::find(local_f8,0x154f79);
              if ((((lVar9 == 0) ||
                   (lVar9 = std::__cxx11::string::find(local_f8,0x154f73), lVar9 != -1)) ||
                  (lVar9 = std::__cxx11::string::find(local_f8,0x154f78), lVar9 == 0)) ||
                 (lVar9 = std::__cxx11::string::find(local_f8,0x154f77), lVar9 != -1)) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_208,"invalid use of \'.\' or \'..\' in chdir",&local_209
                          );
                this_local._7_1_ =
                     Lexer::Error(&(this->super_Parser).lexer_,&local_208,
                                  &(eval.parsed_.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
                std::__cxx11::string::~string((string *)&local_208);
                std::allocator<char>::~allocator(&local_209);
                path.field_2._8_4_ = 1;
              }
              else {
                pFVar1 = (this->super_Parser).file_reader_;
                iVar5 = (*pFVar1->_vptr_FileReader[4])
                                  (pFVar1,(undefined1 *)((long)&rel_path.field_2 + 8),
                                   (undefined1 *)((long)&prev_cwd.field_2 + 8));
                if (iVar5 == 0) {
                  pFVar1 = (this->super_Parser).file_reader_;
                  iVar5 = (*pFVar1->_vptr_FileReader[3])
                                    (pFVar1,local_f8,(undefined1 *)((long)&prev_cwd.field_2 + 8));
                  if (iVar5 == 0) {
                    bVar3 = true;
                    std::__cxx11::string::operator+=((string *)local_f8,'/');
                    path.field_2._8_4_ = 0;
                  }
                  else {
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&subparser.quiet_,"Chdir to \'",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_f8);
                    std::operator+(&local_270,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&subparser.quiet_,"\': ");
                    std::operator+(&local_250,&local_270,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&prev_cwd.field_2 + 8));
                    std::__cxx11::string::operator=
                              ((string *)
                               eval.parsed_.
                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (string *)&local_250);
                    std::__cxx11::string::~string((string *)&local_250);
                    std::__cxx11::string::~string((string *)&local_270);
                    std::__cxx11::string::~string((string *)&subparser.quiet_);
                    this_local._7_1_ = 0;
                    path.field_2._8_4_ = 1;
                  }
                }
                else {
                  std::operator+(&local_230,"Getcwd: ",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&prev_cwd.field_2 + 8));
                  std::__cxx11::string::operator=
                            ((string *)
                             eval.parsed_.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_230
                            );
                  std::__cxx11::string::~string((string *)&local_230);
                  this_local._7_1_ = 0;
                  path.field_2._8_4_ = 1;
                }
              }
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_198,"invalid use of \'chdir\' in include line",&local_199);
            Lexer::Error(&(this->super_Parser).lexer_,&local_198,
                         &(eval.parsed_.
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->first);
            std::__cxx11::string::~string((string *)&local_198);
            std::allocator<char>::~allocator(&local_199);
            bVar2 = 0;
            path.field_2._8_4_ = 3;
          }
        }
        else {
          bVar2 = 0;
          path.field_2._8_4_ = 3;
        }
        EvalString::~EvalString((EvalString *)local_138);
        std::__cxx11::string::~string
                  ((string *)
                   &let_value.parsed_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      } while (path.field_2._8_4_ == 0);
      if (path.field_2._8_4_ == 3) {
LAB_0014234e:
        if (bVar2 != 0) {
          local_2f8 = this->options_;
          ManifestParser((ManifestParser *)local_2f0,(this->super_Parser).state_,
                         (this->super_Parser).file_reader_,local_2f8);
          if (new_scope) {
            this_00 = (BindingEnv *)operator_new(0xb0);
            parent = this->env_;
            std::operator+(&local_318,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&dir_err.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f8);
            BindingEnv::BindingEnv(this_00,parent,(string *)local_f8,&local_318);
            subparser.super_Parser.lexer_.last_token_ = (char *)this_00;
            std::__cxx11::string::~string((string *)&local_318);
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) == 0) {
              BindingEnv::AddRule((BindingEnv *)subparser.super_Parser.lexer_.last_token_,
                                  &State::kPhonyRule);
              i.super__Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>._M_cur =
                   (_Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>)
                   RelPathEnv::AsString_abi_cxx11_
                             ((RelPathEnv *)subparser.super_Parser.lexer_.last_token_);
              local_330._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<StringPiece,_Node_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>_>
                   ::begin(&((this->super_Parser).state_)->paths_);
              while( true ) {
                local_338._M_cur =
                     (__node_type *)
                     std::
                     unordered_map<StringPiece,_Node_*,_std::hash<StringPiece>,_std::equal_to<StringPiece>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>_>
                     ::end(&((this->super_Parser).state_)->paths_);
                bVar4 = std::__detail::operator!=(&local_330,&local_338);
                if (!bVar4) break;
                ppVar8 = std::__detail::
                         _Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true>::
                         operator->((_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true>
                                     *)&local_330);
                StringPiece::AsString_abi_cxx11_((string *)&node,&ppVar8->first);
                lVar9 = std::__cxx11::string::find
                                  ((string *)&node,
                                   (ulong)i.
                                          super__Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>
                                          ._M_cur);
                std::__cxx11::string::~string((string *)&node);
                if (lVar9 == 0) {
                  ppVar8 = std::__detail::
                           _Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true>::
                           operator->((_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true>
                                       *)&local_330);
                  local_360 = ppVar8->second;
                  Node::ResetEnv(local_360,(BindingEnv *)subparser.super_Parser.lexer_.last_token_);
                }
                std::__detail::_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true>::
                operator++((_Node_iterator<std::pair<const_StringPiece,_Node_*>,_false,_true> *)
                           &local_330);
              }
            }
          }
          else {
            subparser.super_Parser.lexer_.last_token_ = (char *)this->env_;
          }
          bVar4 = Parser::Load((Parser *)local_2f0,(string *)local_70,
                               &(eval.parsed_.
                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->first,
                               &(this->super_Parser).lexer_);
          if (!bVar4) {
            bVar2 = 0;
          }
        }
        this_local._7_1_ = bVar2;
        if (((bVar3) &&
            (pFVar1 = (this->super_Parser).file_reader_,
            iVar5 = (*pFVar1->_vptr_FileReader[3])
                              (pFVar1,(undefined1 *)((long)&rel_path.field_2 + 8),
                               (undefined1 *)((long)&prev_cwd.field_2 + 8)), iVar5 != 0)) &&
           (bVar2 != 0)) {
          this_local._7_1_ = 0;
          std::operator+(&local_3c0,"restore cwd = \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&rel_path.field_2 + 8));
          std::operator+(&local_3a0,&local_3c0,"\': ");
          std::operator+(&local_380,&local_3a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&prev_cwd.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)
                     eval.parsed_.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_380);
          std::__cxx11::string::~string((string *)&local_380);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::~string((string *)&local_3c0);
        }
        path.field_2._8_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_f8);
      std::__cxx11::string::~string((string *)(rel_path.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(prev_cwd.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(dir_err.field_2._M_local_buf + 8));
    }
    else {
      this_local._7_1_ = 0;
      path.field_2._8_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_70);
  }
  else {
    this_local._7_1_ = 0;
    path.field_2._8_4_ = 1;
  }
  EvalString::~EvalString((EvalString *)local_40);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ManifestParser::ParseFileInclude(bool new_scope, string* err) {
  EvalString eval;
  if (!lexer_.ReadPath(&eval, err))
    return false;
  string path = eval.Evaluate(env_);

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  bool has_chdir = false;
  string parent_path = env_->AsString();
  string dir_err;
  string prev_cwd;
  string rel_path;
  bool ok = true;  // Always restore prev_cwd, even if there is an error.
  while (lexer_.PeekToken(Lexer::INDENT)) {
    string key;
    EvalString let_value;
    if (!ParseLet(&key, &let_value, err)) {
      ok = false;
      break;
    }
    if (key != "chdir") {
      lexer_.Error("illegal key '" + key + "' (only 'chdir' is supported)",
                   err);
      ok = false;
      break;
    }
    if (!new_scope) {
      lexer_.Error("invalid use of 'chdir' in include line", err);
      ok = false;
      break;
    }
    if (has_chdir) {
      lexer_.Error("duplicate 'chdir' in subninja", err);
      ok = false;
      break;
    }
    rel_path = let_value.Evaluate(env_);
    if (rel_path.find("./") == 0 || rel_path.find("/./") != string::npos ||
        rel_path.find("../") == 0 || rel_path.find("/../") != string::npos) {
      return lexer_.Error("invalid use of '.' or '..' in chdir", err);
    }
    if (file_reader_->Getcwd(&prev_cwd, &dir_err) != FileReader::Okay) {
      *err = "Getcwd: " + dir_err;
      return false;  // Can return because has_chdir is always false here.
    }
    if (file_reader_->Chdir(rel_path, &dir_err) != FileReader::Okay) {
      *err = "Chdir to '" + rel_path + "': " + dir_err;
      return false;
    }
    has_chdir = true;
    rel_path += '/';
  }

  if (ok) {
    ManifestParser subparser(state_, file_reader_, options_);
    if (new_scope) {
      // Note that rel_path of "" (for whatever reason) means no chdir.
      subparser.env_ = new BindingEnv(env_, rel_path,
                                      parent_path + rel_path);

      if (!rel_path.empty()) {
        subparser.env_->AddRule(&State::kPhonyRule);

        const string& abs_path = subparser.env_->AsString();
        // Find all inbound references to this chdir. Their env will be a parent
        // of subparser.env_ and assume no chdir. Replace it so that
        // subparser.env_ is used correctly with the chdir in place.
        for (State::Paths::iterator i = state_->paths_.begin();
            i != state_->paths_.end(); ++i) {
          if (i->first.AsString().find(abs_path) == 0) {
            Node* node = i->second;
            node->ResetEnv(subparser.env_);
          }
        }
      }
    } else {
      subparser.env_ = env_;
    }

    if (!subparser.Load(path, err, &lexer_)) {
      ok = false;
    }
  }

  // Restore prev_cwd. Note that has_chdir is set to true only after
  // file_reader_->Chdir() succeeds, and any errors after that set ok = false.
  // Do not smash the value of err if it was previously set.
  if (has_chdir) {
    if (file_reader_->Chdir(prev_cwd, &dir_err) != FileReader::Okay) {
      if (ok) {
        ok = false;
        *err = "restore cwd = '" + prev_cwd + "': " + dir_err;
      }
    }
  }
  return ok;
}